

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O3

shared_ptr<mocker::SymTbl::Scope> __thiscall mocker::SymTbl::getScope(SymTbl *this,ScopeID *ids)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _func_int **pp_Var3;
  element_type *peVar4;
  long lVar5;
  out_of_range *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _func_int **pp_Var6;
  shared_ptr<mocker::SymTbl::Scope> sVar7;
  
  (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (ids->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (ids->ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  pp_Var6 = (in_RDX._M_pi)->_vptr__Sp_counted_base;
  pp_Var3 = *(_func_int ***)&(in_RDX._M_pi)->_M_use_count;
  if (pp_Var6 != pp_Var3) {
    do {
      peVar4 = (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      lVar5 = (long)(peVar4->subscopes).
                    super__Vector_base<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((_func_int *)
          ((long)*(pointer *)
                  ((long)&(peVar4->subscopes).
                          super__Vector_base<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
                          ._M_impl.super__Vector_impl_data + 8) - lVar5 >> 4) <= *pp_Var6) {
        this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_00,"Scope required does not exist");
        __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      puVar1 = (undefined8 *)(lVar5 + (long)*pp_Var6 * 0x10);
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*puVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1));
      pp_Var6 = pp_Var6 + 1;
      in_RDX._M_pi = extraout_RDX;
    } while (pp_Var6 != pp_Var3);
  }
  sVar7.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar7.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::SymTbl::Scope>)
         sVar7.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SymTbl::Scope> SymTbl::getScope(const ScopeID &ids) const {
  auto res = root;
  for (const std::size_t i : ids.ids) {
    if (i >= res->subscopes.size())
      throw std::out_of_range("Scope required does not exist");
    res = res->subscopes[i];
  }
  return res;
}